

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

void Ins_UNKNOWN(TT_ExecContext exc)

{
  int iVar1;
  TT_CallStack pTVar2;
  TT_DefArray pTVar3;
  TT_DefArray pTVar4;
  
  pTVar3 = exc->IDefs;
  if (pTVar3 == (TT_DefArray)0x0) {
    pTVar4 = (TT_DefArray)0x0;
  }
  else {
    pTVar4 = pTVar3 + exc->numIDefs;
  }
  while( true ) {
    if (pTVar4 <= pTVar3) {
      exc->error = 0x80;
      return;
    }
    if ((exc->opcode == (FT_Byte)pTVar3->opc) && (pTVar3->active != '\0')) break;
    pTVar3 = pTVar3 + 1;
  }
  iVar1 = exc->callTop;
  if (iVar1 < exc->callSize) {
    pTVar2 = exc->callStack;
    exc->callTop = iVar1 + 1;
    pTVar2[iVar1].Caller_Range = exc->curRange;
    pTVar2[iVar1].Caller_IP = exc->IP + 1;
    pTVar2[iVar1].Cur_Count = 1;
    pTVar2[iVar1].Def = pTVar3;
    Ins_Goto_CodeRange(exc,pTVar3->range,pTVar3->start);
    exc->step_ins = '\0';
    return;
  }
  exc->error = 0x82;
  return;
}

Assistant:

static void
  Ins_UNKNOWN( TT_ExecContext  exc )
  {
    TT_DefRecord*  def   = exc->IDefs;
    TT_DefRecord*  limit = FT_OFFSET( def, exc->numIDefs );


    for ( ; def < limit; def++ )
    {
      if ( (FT_Byte)def->opc == exc->opcode && def->active )
      {
        TT_CallRec*  call;


        if ( exc->callTop >= exc->callSize )
        {
          exc->error = FT_THROW( Stack_Overflow );
          return;
        }

        call = exc->callStack + exc->callTop++;

        call->Caller_Range = exc->curRange;
        call->Caller_IP    = exc->IP + 1;
        call->Cur_Count    = 1;
        call->Def          = def;

        Ins_Goto_CodeRange( exc, def->range, def->start );

        exc->step_ins = FALSE;
        return;
      }
    }

    exc->error = FT_THROW( Invalid_Opcode );
  }